

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EAMAdapter.cpp
# Opt level: O2

RealType __thiscall OpenMD::EAMAdapter::getF3minus(EAMAdapter *this)

{
  ZhouParameters zhouParam;
  ZhouParameters local_118;
  
  getZhouParam(&local_118,this);
  ZhouParameters::~ZhouParameters(&local_118);
  return local_118.F3minus;
}

Assistant:

RealType EAMAdapter::getF3minus() {
    ZhouParameters zhouParam = getZhouParam();
    return zhouParam.F3minus;
  }